

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

bool __thiscall
irr::gui::CGUIListBox::getSerializationLabels
          (CGUIListBox *this,EGUI_LISTBOX_COLOR colorType,stringc *useColorLabel,stringc *colorLabel
          )

{
  char *in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_ffffffffffffffe8;
  
  switch(in_ESI) {
  case 0:
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    break;
  case 1:
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    break;
  case 2:
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    break;
  case 3:
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    core::string<char>::operator=((string<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX)
    ;
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool CGUIListBox::getSerializationLabels(EGUI_LISTBOX_COLOR colorType, core::stringc &useColorLabel, core::stringc &colorLabel) const
{
	switch (colorType) {
	case EGUI_LBC_TEXT:
		useColorLabel = "UseColText";
		colorLabel = "ColText";
		break;
	case EGUI_LBC_TEXT_HIGHLIGHT:
		useColorLabel = "UseColTextHl";
		colorLabel = "ColTextHl";
		break;
	case EGUI_LBC_ICON:
		useColorLabel = "UseColIcon";
		colorLabel = "ColIcon";
		break;
	case EGUI_LBC_ICON_HIGHLIGHT:
		useColorLabel = "UseColIconHl";
		colorLabel = "ColIconHl";
		break;
	default:
		return false;
	}
	return true;
}